

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Token * __thiscall llvm::yaml::Scanner::peekNext(Scanner *this)

{
  list_type *plVar1;
  uint uVar2;
  void *pvVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ilist_node_base<false> *piVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  Token local_58;
  
  plVar1 = &(this->TokenQueue).List;
  bVar4 = 0;
  do {
    piVar8 = (plVar1->Sentinel).
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Prev;
    if (!(bool)(~bVar4 & piVar8 != (ilist_node_base<false> *)plVar1)) {
      bVar5 = fetchMoreTokens(this);
      if (!bVar5) {
        AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
        ::clear(&this->TokenQueue);
        local_58.Value._M_dataplus._M_p = (pointer)&local_58.Value.field_2;
        local_58.Range.Length = 0;
        local_58.Value.field_2._8_8_ = 0;
        local_58.Value._M_string_length = 0;
        local_58.Kind = TK_Error;
        local_58._4_4_ = 0;
        local_58.Range.Data = (char *)0x0;
        local_58.Value.field_2._M_allocated_capacity = 0;
        AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
        ::push_back(&this->TokenQueue,&local_58);
        std::__cxx11::string::_M_dispose();
        piVar8 = (this->TokenQueue).List.Sentinel.
                 super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                 .super_node_base_type.Next;
        break;
      }
      piVar8 = (plVar1->Sentinel).
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
    }
    if (piVar8 == (ilist_node_base<false> *)plVar1) {
      __assert_fail("!TokenQueue.empty() && \"fetchMoreTokens lied about getting tokens!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                    ,0x31e,"Token &llvm::yaml::Scanner::peekNext()");
    }
    removeStaleSimpleKeyCandidates(this);
    piVar8 = (this->TokenQueue).List.Sentinel.
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Next;
    pvVar3 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    uVar2 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Size;
    lVar6 = (ulong)uVar2 * 0x18;
    uVar11 = (ulong)(uVar2 >> 2);
    plVar10 = (long *)((long)pvVar3 + uVar11 * 0x60);
    plVar9 = (long *)((long)pvVar3 + 0x30);
    for (uVar12 = uVar11; 0 < (long)uVar12; uVar12 = uVar12 - 1) {
      if ((ilist_node_base<false> *)plVar9[-6] == piVar8) {
        plVar9 = plVar9 + -6;
        goto LAB_001893c4;
      }
      if ((ilist_node_base<false> *)plVar9[-3] == piVar8) {
        plVar9 = plVar9 + -3;
        goto LAB_001893c4;
      }
      if ((ilist_node_base<false> *)*plVar9 == piVar8) goto LAB_001893c4;
      if ((ilist_node_base<false> *)plVar9[3] == piVar8) {
        plVar9 = plVar9 + 3;
        goto LAB_001893c4;
      }
      plVar9 = plVar9 + 0xc;
    }
    lVar7 = (long)(lVar6 + uVar11 * -0x60) / 0x18;
    if (lVar7 == 1) {
LAB_001893aa:
      plVar9 = plVar10;
      if ((ilist_node_base<false> *)*plVar10 != piVar8) break;
    }
    else if (lVar7 == 2) {
LAB_001893a1:
      plVar9 = plVar10;
      if ((ilist_node_base<false> *)*plVar10 != piVar8) {
        plVar10 = plVar10 + 3;
        goto LAB_001893aa;
      }
    }
    else {
      if (lVar7 != 3) break;
      plVar9 = plVar10;
      if ((ilist_node_base<false> *)*plVar10 != piVar8) {
        plVar10 = plVar10 + 3;
        goto LAB_001893a1;
      }
    }
LAB_001893c4:
    bVar4 = 1;
  } while (plVar9 != (long *)((long)pvVar3 + lVar6));
  return (Token *)(piVar8 + 1);
}

Assistant:

Token &Scanner::peekNext() {
  // If the current token is a possible simple key, keep parsing until we
  // can confirm.
  bool NeedMore = false;
  while (true) {
    if (TokenQueue.empty() || NeedMore) {
      if (!fetchMoreTokens()) {
        TokenQueue.clear();
        TokenQueue.push_back(Token());
        return TokenQueue.front();
      }
    }
    assert(!TokenQueue.empty() &&
            "fetchMoreTokens lied about getting tokens!");

    removeStaleSimpleKeyCandidates();
    SimpleKey SK;
    SK.Tok = TokenQueue.begin();
    if (!is_contained(SimpleKeys, SK))
      break;
    else
      NeedMore = true;
  }
  return TokenQueue.front();
}